

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecPOMDPDiscrete.cpp
# Opt level: O0

void __thiscall
DecPOMDPDiscrete::DecPOMDPDiscrete(DecPOMDPDiscrete *this,string *name,string *descr,string *pf)

{
  string *in_RCX;
  string *in_RDX;
  string *in_RSI;
  void **in_RDI;
  DecPOMDPDiscreteInterface *this_00;
  MultiAgentDecisionProcessDiscrete *unaff_retaddr;
  void **vtt;
  
  this_00 = (DecPOMDPDiscreteInterface *)(in_RDI + 0x44);
  vtt = in_RDI;
  MultiAgentDecisionProcessInterface::MultiAgentDecisionProcessInterface
            ((MultiAgentDecisionProcessInterface *)this_00);
  POSGInterface::POSGInterface((POSGInterface *)this_00,&PTR_PTR_00d407e0);
  DecPOMDPInterface::DecPOMDPInterface((DecPOMDPInterface *)this_00,&PTR_PTR_00d407c8);
  MultiAgentDecisionProcessDiscreteInterface::MultiAgentDecisionProcessDiscreteInterface
            ((MultiAgentDecisionProcessDiscreteInterface *)(in_RDI + 0x45),
             &PTR_construction_vtable_384__00d407f0);
  DecPOMDPDiscreteInterface::DecPOMDPDiscreteInterface
            (this_00,&PTR_construction_vtable_232__00d407a0);
  MultiAgentDecisionProcessDiscrete::MultiAgentDecisionProcessDiscrete
            (unaff_retaddr,vtt,in_RSI,in_RDX,in_RCX);
  DecPOMDP::DecPOMDP((DecPOMDP *)(in_RDI + 0x40),&PTR_construction_vtable_176__00d40750);
  *in_RDI = vtable + 0x60;
  in_RDI[0x44] = vtable + 0x460;
  in_RDI[0x44] = vtable + 0x460;
  in_RDI[0x44] = vtable + 0x460;
  in_RDI[0x44] = vtable + 0x460;
  in_RDI[0x45] = vtable + 0x6b8;
  in_RDI[0x40] = vtable + 0x2d8;
  *(undefined1 *)((long)in_RDI + 0x214) = 0;
  in_RDI[0x43] = (void *)0x0;
  return;
}

Assistant:

DecPOMDPDiscrete::DecPOMDPDiscrete(const string &name,
                                   const string &descr,
                                   const string &pf) :
    MultiAgentDecisionProcessDiscrete(name, descr, pf)
{
    _m_initialized = false;
    _m_p_rModel = 0;
}